

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O0

void chapter1::demo2_cstyle(void)

{
  _Setw _Var1;
  istream *piVar2;
  size_t sVar3;
  ostream *poVar4;
  char local_16 [8];
  char user_name [10];
  int size;
  
  user_name[2] = '\n';
  user_name[3] = '\0';
  user_name[4] = '\0';
  user_name[5] = '\0';
  std::operator<<((ostream *)&std::cout,"Please enter your name: ");
  piVar2 = (istream *)std::istream::operator>>((istream *)&std::cin,std::noskipws);
  _Var1 = std::setw(10);
  piVar2 = std::operator>>(piVar2,_Var1);
  std::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar2,local_16);
  sVar3 = strlen(local_16);
  if (sVar3 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"The user with no name");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else if (sVar3 == 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"The name is too short");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (sVar3 == 9) {
      std::operator<<((ostream *)&std::cout,"Too big\n");
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Hello, ");
    poVar4 = std::operator<<(poVar4,local_16);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void demo2_cstyle() {
        const int size = 10;
        char user_name[size];

        cout << "Please enter your name: ";
        cin >> noskipws >> setw(size) >> user_name;

        switch (strlen(user_name)) {
            case 0:
                cout << "The user with no name" << endl;
                break;
            case 1:
                cout << "The name is too short" << endl;
                break;
            case 9:
                cout << "Too big\n";
            default:
                cout << "Hello, "
                     << user_name
                     << endl;
                break;
        }
    }